

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_set.c
# Opt level: O0

int mpt_object_set(mpt_object *obj,char *prop,char *fmt,...)

{
  _func_int_mpt_object_ptr_char_ptr_mpt_convertable_ptr *p_Var1;
  char in_AL;
  mpt_metatype *pmVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_48 [4];
  int ret;
  va_list va;
  char *fmt_local;
  char *prop_local;
  mpt_object *obj_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  if (fmt == (char *)0x0) {
    obj_local._4_4_ = (*obj->_vptr->set_property)(obj,prop,(mpt_convertable *)0x0);
  }
  else if (*fmt == '\0') {
    p_Var1 = obj->_vptr->set_property;
    pmVar2 = mpt_metatype_default();
    obj_local._4_4_ = (*p_Var1)(obj,prop,(mpt_convertable *)pmVar2);
  }
  else {
    va[0].overflow_arg_area = local_108;
    va[0]._0_8_ = &stack0x00000008;
    ret = 0x30;
    local_48 = (undefined1  [4])0x18;
    obj_local._4_4_ = process_object_format(obj,prop,fmt,(__va_list_tag *)local_48);
  }
  return obj_local._4_4_;
}

Assistant:

extern int mpt_object_set(MPT_INTERFACE(object) *obj, const char *prop, const char *fmt, ...)
{
	va_list va;
	int ret;
	
	if (!fmt) {
		return obj->_vptr->set_property(obj, prop, 0);
	}
	if (!fmt[0]) {
		return obj->_vptr->set_property(obj, prop, (MPT_INTERFACE(convertable) *) mpt_metatype_default());
	}
	va_start(va, fmt);
	ret = process_object_format(obj, prop, fmt, va);
	va_end(va);
	
	return ret;
}